

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

int iutest::detail::iuPairwiseGeneratorBase::GetParam<2,int>
              (vector<int,_std::allocator<int>_> *params,ParamIndexes<2> *indexes,int raw)

{
  uint raw_00;
  ParamIndexes<2> *indexes_00;
  result_type seed;
  int iVar1;
  iuRandom *this;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_2c [4];
  int index;
  iuTypedRandom<int> rnd;
  int raw_local;
  ParamIndexes<2> *indexes_local;
  vector<int,_std::allocator<int>_> *params_local;
  
  rnd.m_rnd.m_engine.m_v3 = raw;
  unique0x10000096 = indexes;
  this = TestEnv::genrand();
  seed = iuRandom::operator()(this);
  iuTypedRandom<int>::iuTypedRandom((iuTypedRandom<int> *)local_2c,seed);
  indexes_00 = stack0xffffffffffffffe8;
  raw_00 = rnd.m_rnd.m_engine.m_v3;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(params);
  iVar1 = GetParamIndex<2,iutest::detail::iuTypedRandom<int>>
                    (indexes_00,raw_00,(int)sVar2,(iuTypedRandom<int> *)local_2c);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](params,(long)iVar1);
  return *pvVar3;
}

Assistant:

static T GetParam(const ::std::vector<T>& params, const ParamIndexes<N>& indexes, int raw)
    {
        iuTypedRandom<int> rnd(TestEnv::genrand()());
        const int index = GetParamIndex(indexes, raw, static_cast<int>(params.size()), rnd);
        return params[index];
    }